

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O1

void __thiscall
TPZMatRed<long_double,_TPZFMatrix<long_double>_>::UGlobal
          (TPZMatRed<long_double,_TPZFMatrix<long_double>_> *this,TPZFMatrix<long_double> *U1,
          TPZFMatrix<long_double> *result)

{
  TPZFMatrix<long_double> *y;
  TPZMatrixSolver<long_double> *pTVar1;
  unkbyte10 Var2;
  unkbyte10 Var3;
  unkbyte10 Var4;
  unkbyte10 Var5;
  unkbyte10 Var6;
  unkbyte10 Var7;
  longdouble *plVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  unkbyte10 in_ST0;
  unkbyte10 Var14;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 Var15;
  unkbyte10 Var16;
  TPZFMatrix<long_double> K01U1;
  TPZFMatrix<long_double> u0;
  TPZFMatrix<long_double> local_158;
  TPZFMatrix<long_double> local_c0;
  
  lVar10 = (this->fF0).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow;
  lVar12 = (this->fF0).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_c0.fElem = (longdouble *)0x0;
  local_c0.fGiven = (longdouble *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = lVar10;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = lVar12;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_c0.fWork.fStore = (longdouble *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar11 = lVar12 * lVar10;
  if (uVar11 != 0) {
    local_c0.fElem = (longdouble *)operator_new__(-(ulong)(uVar11 >> 0x3c != 0) | uVar11 * 0x10);
  }
  y = &this->fF0;
  if (this->fK01IsComputed == true) {
    if (this->fF0IsComputed == false) {
      DecomposeK00(this);
      pTVar1 = ((this->fSolver).fRef)->fPointer;
      (*(pTVar1->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(pTVar1,y,y,0);
      this->fF0IsComputed = true;
    }
    Var15 = in_ST5;
    Var16 = in_ST5;
    TPZFMatrix<long_double>::MultAdd(&this->fK01,U1,y,&local_c0,-(longdouble)1,(longdouble)1,0);
  }
  else {
    lVar10 = (this->fK01).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow;
    lVar12 = (U1->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
    local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow._0_2_ = (undefined2)lVar10;
    local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow._2_6_ =
         (undefined6)((ulong)lVar10 >> 0x10);
    local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01845cc0;
    local_158.fElem = (longdouble *)0x0;
    local_158.fGiven = (longdouble *)0x0;
    local_158.fSize = 0;
    local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = lVar12;
    TPZVec<int>::TPZVec(&local_158.fPivot.super_TPZVec<int>,0);
    local_158.fPivot.super_TPZVec<int>.fStore = local_158.fPivot.fExtAlloc;
    local_158.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_158.fPivot.super_TPZVec<int>.fNElements = 0;
    local_158.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_158.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
    local_158.fWork.fStore = (longdouble *)0x0;
    local_158.fWork.fNElements = 0;
    local_158.fWork.fNAlloc = 0;
    uVar11 = lVar12 * lVar10;
    if ((uVar11 != 0) &&
       (local_158.fElem =
             (longdouble *)operator_new__(-(ulong)(uVar11 >> 0x3c != 0) | uVar11 * 0x10),
       0 < (long)uVar11)) {
      plVar8 = local_158.fElem;
      do {
        *plVar8 = (longdouble)0;
        plVar8 = plVar8 + 1;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    Var15 = in_ST5;
    Var16 = in_ST5;
    TPZFMatrix<long_double>::MultAdd(&this->fK01,U1,y,&local_158,-(longdouble)1,(longdouble)1,0);
    DecomposeK00(this);
    pTVar1 = ((this->fSolver).fRef)->fPointer;
    (*(pTVar1->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])
              (pTVar1,&local_158,&local_c0,0);
    TPZFMatrix<long_double>::~TPZFMatrix(&local_158);
  }
  (*(result->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xe])(result,this->fDim1 + this->fDim0,
           (this->fF0).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol);
  if (0 < (this->fF0).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol) {
    lVar10 = 0;
    lVar12 = 0;
    do {
      if (this->fDim0 < 1) {
        lVar9 = 0;
      }
      else {
        lVar13 = 0;
        lVar9 = 0;
        do {
          Var16 = *(unkbyte10 *)
                   ((long)local_c0.fElem +
                   lVar13 + local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow * lVar10)
          ;
          local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable = (_func_int **)Var16;
          local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow._0_2_ =
               (undefined2)((unkuint10)Var16 >> 0x40);
          Var16 = Var15;
          (*(result->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(result,lVar9,lVar12,&local_158);
          lVar9 = lVar9 + 1;
          lVar13 = lVar13 + 0x10;
        } while (lVar9 < this->fDim0);
      }
      if (lVar9 < this->fDim1 + this->fDim0) {
        lVar13 = 0;
        Var14 = in_ST0;
        Var2 = in_ST1;
        Var3 = in_ST2;
        Var4 = in_ST3;
        Var5 = in_ST4;
        Var6 = in_ST5;
        Var7 = Var15;
        Var15 = Var16;
        do {
          in_ST5 = Var7;
          in_ST4 = Var6;
          in_ST3 = Var5;
          in_ST2 = Var4;
          in_ST1 = Var3;
          in_ST0 = Var2;
          (*(U1->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(U1,lVar13,lVar12);
          local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable = (_func_int **)Var14;
          local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow._0_2_ =
               (undefined2)((unkuint10)Var14 >> 0x40);
          (*(result->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(result,lVar13 + lVar9,lVar12,&local_158);
          lVar13 = lVar13 + 1;
          Var14 = in_ST0;
          Var2 = in_ST1;
          Var3 = in_ST2;
          Var4 = in_ST3;
          Var5 = in_ST4;
          Var6 = in_ST5;
          Var7 = Var15;
          Var16 = Var15;
        } while (lVar13 + lVar9 < this->fDim1 + this->fDim0);
      }
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar12 < (this->fF0).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol);
  }
  TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZMatRed<TVar, TSideMatrix >::UGlobal(const TPZFMatrix<TVar> & U1, TPZFMatrix<TVar> & result)
{
	TPZFMatrix<TVar> u0( fF0.Rows() , fF0.Cols() );
	
	if(fK01IsComputed)
	{
		//[u0]=[A00^-1][F0]-[A00^-1][A01]
        //compute [F0]=[A00^-1][F0]
        if(!fF0IsComputed)
        {
            DecomposeK00();
            fSolver->Solve(fF0,fF0);
            fF0IsComputed = true;
        }
		//make [u0]=[F0]-[U1]
		fK01.MultAdd(U1,(fF0),u0,-1,1);
	} else {
        TPZFMatrix<TVar> K01U1(fK01.Rows(),U1.Cols(),0.);
        fK01.MultAdd(U1,fF0,K01U1,-1.,1.);
        DecomposeK00();
        fSolver->Solve(K01U1, u0);
	}
	
	//compute result
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
        U1.Print("U1 = ",sout,EMathematicaInput);
		fF0.Print("fF0 ",sout,EMathematicaInput);
		u0.Print("u0 " ,sout,EMathematicaInput);
		LOGPZ_DEBUG(logger,sout.str())   
		
	}
#endif
	
	result.Redim( fDim0+fDim1,fF0.Cols() );
	int64_t c,r,r1;
	
	for(c=0; c<fF0.Cols(); c++)
	{
		r1=0;
		for(r=0; r<fDim0; r++)
		{
			result.PutVal( r,c,u0.GetVal(r,c) ) ;
		}
		//aqui r=fDim0
		for( ;r<fDim0+fDim1; r++)
		{
			result.PutVal( r,c,U1.GetVal(r1++,c) );
		}
	}
}